

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrCompositionLayerEquirectKHR *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  invalid_argument *piVar4;
  XrGeneratedDispatchTable *pXVar5;
  XrCompositionLayerEquirectKHR *in_stack_fffffffffffffa68;
  allocator local_589;
  string scale_prefix;
  string bias_prefix;
  string type_prefix;
  string radius_prefix;
  string pose_prefix;
  string subimage_prefix;
  string eyevisibility_prefix;
  string space_prefix;
  string layerflags_prefix;
  string next_prefix;
  undefined1 local_448 [32];
  string local_428;
  undefined1 local_408 [32];
  string local_3e8;
  undefined1 local_3c8 [32];
  string local_3a8;
  undefined1 local_388 [32];
  string local_368;
  string local_348;
  ostringstream oss_space;
  uint auStack_310 [2];
  PFN_xrCreateSwapchain local_308;
  PFN_xrCreateAction p_Stack_300;
  PFN_xrLocateSpace local_2f8;
  PFN_xrAcquireSwapchainImage p_Stack_2f0;
  ostringstream oss_radius;
  undefined8 local_1a0 [46];
  
  PointerToHexString<XrCompositionLayerEquirectKHR>(in_stack_fffffffffffffa68);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_space);
  std::__cxx11::string::~string((string *)&oss_space);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_space,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_space);
    std::__cxx11::string::~string((string *)&oss_space);
  }
  else {
    local_2f8 = (PFN_xrLocateSpace)0x0;
    p_Stack_2f0 = (PFN_xrAcquireSwapchainImage)0x0;
    local_308 = (PFN_xrCreateSwapchain)0x0;
    p_Stack_300 = (PFN_xrCreateAction)0x0;
    auStack_310[0] = 0;
    auStack_310[1] = 0;
    _oss_space = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_space);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,(char (*) [64])&oss_space);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_348,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_348,contents);
  std::__cxx11::string::~string((string *)&local_348);
  if (!bVar2) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&layerflags_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&layerflags_prefix);
  std::__cxx11::to_string((string *)&oss_space,value->layerFlags);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[24],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [24])"XrCompositionLayerFlags",&layerflags_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_space);
  std::__cxx11::string::~string((string *)&oss_space);
  std::__cxx11::string::string((string *)&space_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&space_prefix);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_space);
  *(uint *)((long)auStack_310 + *(long *)(_oss_space + -0x18)) =
       *(uint *)((long)auStack_310 + *(long *)(_oss_space + -0x18)) & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(&oss_space);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[8],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [8])"XrSpace",&space_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_radius);
  std::__cxx11::string::~string((string *)&oss_radius);
  std::__cxx11::string::string((string *)&eyevisibility_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&eyevisibility_prefix);
  std::__cxx11::to_string((string *)&oss_radius,value->eyeVisibility);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [16])"XrEyeVisibility",&eyevisibility_prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_radius);
  std::__cxx11::string::~string((string *)&oss_radius);
  std::__cxx11::string::string((string *)&subimage_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&subimage_prefix);
  std::__cxx11::string::string((string *)(local_388 + 0x20),(string *)&subimage_prefix);
  pXVar5 = (XrGeneratedDispatchTable *)local_388;
  std::__cxx11::string::string((string *)pXVar5,"XrSwapchainSubImage",(allocator *)&oss_radius);
  bVar2 = ApiDumpOutputXrStruct
                    (pXVar5,&value->subImage,(string *)(local_388 + 0x20),(string *)local_388,false,
                     contents);
  std::__cxx11::string::~string((string *)local_388);
  std::__cxx11::string::~string((string *)(local_388 + 0x20));
  if (!bVar2) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::string((string *)&pose_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&pose_prefix);
  std::__cxx11::string::string((string *)(local_3c8 + 0x20),(string *)&pose_prefix);
  pXVar5 = (XrGeneratedDispatchTable *)local_3c8;
  std::__cxx11::string::string((string *)pXVar5,"XrPosef",(allocator *)&oss_radius);
  bVar2 = ApiDumpOutputXrStruct
                    (pXVar5,&value->pose,(string *)(local_3c8 + 0x20),(string *)local_3c8,false,
                     contents);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::~string((string *)(local_3c8 + 0x20));
  if (bVar2) {
    std::__cxx11::string::string((string *)&radius_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&radius_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_radius);
    *(undefined8 *)((long)local_1a0 + *(long *)(_oss_radius + -0x18)) = 0x20;
    std::ostream::operator<<((ostream *)&oss_radius,value->radius);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [6])"float",&radius_prefix,&scale_prefix);
    std::__cxx11::string::~string((string *)&scale_prefix);
    std::__cxx11::string::string((string *)&scale_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&scale_prefix);
    std::__cxx11::string::string((string *)(local_408 + 0x20),(string *)&scale_prefix);
    pXVar5 = (XrGeneratedDispatchTable *)local_408;
    std::__cxx11::string::string((string *)pXVar5,"XrVector2f",(allocator *)&bias_prefix);
    bVar2 = ApiDumpOutputXrStruct
                      (pXVar5,&value->scale,(string *)(local_408 + 0x20),(string *)local_408,false,
                       contents);
    std::__cxx11::string::~string((string *)local_408);
    std::__cxx11::string::~string((string *)(local_408 + 0x20));
    if (!bVar2) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::string::string((string *)&bias_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&bias_prefix);
    std::__cxx11::string::string((string *)(local_448 + 0x20),(string *)&bias_prefix);
    pXVar5 = (XrGeneratedDispatchTable *)local_448;
    std::__cxx11::string::string((string *)pXVar5,"XrVector2f",&local_589);
    bVar2 = ApiDumpOutputXrStruct
                      (pXVar5,&value->bias,(string *)(local_448 + 0x20),(string *)local_448,false,
                       contents);
    std::__cxx11::string::~string((string *)local_448);
    std::__cxx11::string::~string((string *)(local_448 + 0x20));
    if (bVar2) {
      std::__cxx11::string::~string((string *)&bias_prefix);
      std::__cxx11::string::~string((string *)&scale_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_radius);
      std::__cxx11::string::~string((string *)&radius_prefix);
      std::__cxx11::string::~string((string *)&pose_prefix);
      std::__cxx11::string::~string((string *)&subimage_prefix);
      std::__cxx11::string::~string((string *)&eyevisibility_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_space);
      std::__cxx11::string::~string((string *)&space_prefix);
      std::__cxx11::string::~string((string *)&layerflags_prefix);
      std::__cxx11::string::~string((string *)&next_prefix);
      std::__cxx11::string::~string((string *)&type_prefix);
      return true;
    }
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrCompositionLayerEquirectKHR* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string layerflags_prefix = prefix;
        layerflags_prefix += "layerFlags";
        contents.emplace_back("XrCompositionLayerFlags", layerflags_prefix, std::to_string(value->layerFlags));
        std::string space_prefix = prefix;
        space_prefix += "space";
        std::ostringstream oss_space;
        oss_space << std::hex << reinterpret_cast<const void*>(value->space);
        contents.emplace_back("XrSpace", space_prefix, oss_space.str());
        std::string eyevisibility_prefix = prefix;
        eyevisibility_prefix += "eyeVisibility";
        contents.emplace_back("XrEyeVisibility", eyevisibility_prefix, std::to_string(value->eyeVisibility));
        std::string subimage_prefix = prefix;
        subimage_prefix += "subImage";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->subImage, subimage_prefix, "XrSwapchainSubImage", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string pose_prefix = prefix;
        pose_prefix += "pose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->pose, pose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string radius_prefix = prefix;
        radius_prefix += "radius";
        std::ostringstream oss_radius;
        oss_radius << std::setprecision(32) << (value->radius);
        contents.emplace_back("float", radius_prefix, oss_radius.str());
        std::string scale_prefix = prefix;
        scale_prefix += "scale";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->scale, scale_prefix, "XrVector2f", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string bias_prefix = prefix;
        bias_prefix += "bias";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->bias, bias_prefix, "XrVector2f", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}